

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

double __thiscall ON_LengthValue::Length(ON_LengthValue *this,LengthUnitSystem context_unit_system)

{
  double dVar1;
  LengthUnitSystem LVar2;
  double dVar3;
  LengthUnitSystem context_unit_system_local;
  ON_LengthValue *this_local;
  
  if (context_unit_system == None) {
    this_local = (ON_LengthValue *)this->m_length;
  }
  else {
    LVar2 = ON_UnitSystem::UnitSystem(&this->m_length_unit_system);
    if ((LVar2 == context_unit_system) && (context_unit_system != Unset)) {
      this_local = (ON_LengthValue *)this->m_length;
    }
    else {
      dVar1 = this->m_length;
      dVar3 = ON::UnitScale(&this->m_length_unit_system,context_unit_system);
      this_local = (ON_LengthValue *)(dVar1 * dVar3);
    }
  }
  return (double)this_local;
}

Assistant:

double ON_LengthValue::Length(
  ON::LengthUnitSystem context_unit_system
) const
{
  if ( ON::LengthUnitSystem::None == context_unit_system)
    return m_length;
  if ( m_length_unit_system.UnitSystem() == context_unit_system && ON::LengthUnitSystem::Unset != context_unit_system)
    return m_length;
  return m_length*ON::UnitScale(m_length_unit_system, context_unit_system);
}